

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O3

bool __thiscall SchemeInt::is_eq(SchemeInt *this,shared_ptr<SchemeObject> *a)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar2;
  bool bVar3;
  
  peVar1 = (a->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = false;
    lVar2 = __dynamic_cast(peVar1,&SchemeObject::typeinfo,&typeinfo,0);
    if (lVar2 != 0) {
      this_00 = (a->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar3 = this->value == *(long *)(lVar2 + 8);
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        bVar3 = this->value == *(long *)(lVar2 + 8);
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
  }
  return bVar3;
}

Assistant:

bool SchemeInt::is_eq(const std::shared_ptr<SchemeObject> &a) const
{
    auto p = std::dynamic_pointer_cast<SchemeInt>(a);
    return p && value == p->value;
}